

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

OPJ_BOOL opj_t2_read_packet_header
                   (opj_t2_t *p_t2,opj_tcd_tile_t *p_tile,opj_tcp_t *p_tcp,opj_pi_iterator_t *p_pi,
                   OPJ_BOOL *p_is_data_present,OPJ_BYTE *p_src_data,OPJ_UINT32 *p_data_read,
                   OPJ_UINT32 p_max_length,opj_packet_info_t *p_pack_info,opj_event_mgr_t *p_manager
                   )

{
  uint uVar1;
  opj_tcd_precinct_t *poVar2;
  opj_tcd_seg_t *poVar3;
  OPJ_BOOL OVar4;
  int iVar5;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 OVar7;
  uint uVar8;
  opj_bio_t *bio;
  ptrdiff_t pVar9;
  OPJ_UINT32 *pOVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  OPJ_UINT32 i;
  opj_tcd_band_t *poVar14;
  uint uVar15;
  opj_cp_t *poVar16;
  opj_t2_t *poVar17;
  OPJ_BOOL *pOVar18;
  ulong uVar19;
  opj_tcd_cblk_dec_t *cblk;
  OPJ_BYTE *pOVar20;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 l_remaining_length;
  OPJ_UINT32 local_94;
  opj_cp_t **local_90;
  opj_cp_t *local_70;
  OPJ_BOOL *local_68;
  OPJ_UINT32 local_60;
  uint local_5c;
  opj_t2_t *local_58;
  opj_tcd_band_t *local_50;
  opj_cp_t *local_48;
  OPJ_BYTE *local_40;
  int local_34;
  
  lVar11 = (ulong)p_pi->resno * 0xc0 + (long)p_tile->distolayer[(ulong)p_pi->compno * 0xe + -2];
  local_70 = (opj_cp_t *)p_src_data;
  local_68 = p_is_data_present;
  if ((p_pi->layno == 0) && (*(int *)(lVar11 + 0x18) != 0)) {
    poVar14 = (opj_tcd_band_t *)(lVar11 + 0x20);
    uVar15 = 0;
    do {
      OVar4 = opj_tcd_is_band_empty(poVar14);
      if (OVar4 == 0) {
        uVar1 = p_pi->precno;
        if (poVar14->precincts_data_size / 0x38 <= uVar1) {
          opj_event_msg((opj_event_mgr_t *)p_pack_info,1,"Invalid precinct\n");
          return 0;
        }
        poVar2 = poVar14->precincts;
        opj_tgt_reset(poVar2[uVar1].incltree);
        opj_tgt_reset(poVar2[uVar1].imsbtree);
        iVar5 = poVar2[uVar1].ch * poVar2[uVar1].cw;
        if (iVar5 != 0) {
          pOVar10 = &(poVar2[uVar1].cblks.enc)->data_size;
          do {
            *(undefined8 *)(pOVar10 + -1) = 0;
            pOVar10 = pOVar10 + 0x12;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
      }
      poVar14 = poVar14 + 1;
      uVar15 = uVar15 + 1;
    } while (uVar15 < *(uint *)(lVar11 + 0x18));
  }
  poVar16 = (opj_cp_t *)p_src_data;
  if ((p_tcp->csty & 2) != 0) {
    if (p_max_length < 6) {
      pcVar12 = "Not enough space for expected SOP marker\n";
    }
    else {
      if ((*p_src_data == 0xff) && (p_src_data[1] == 0x91)) {
        poVar16 = (opj_cp_t *)(p_src_data + 6);
        local_70 = poVar16;
        goto LAB_00135dd5;
      }
      pcVar12 = "Expected SOP marker\n";
    }
    opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar12);
  }
LAB_00135dd5:
  bio = opj_bio_create();
  if (bio == (opj_bio_t *)0x0) {
    return 0;
  }
  if (((ulong)p_t2[9].image & 1) == 0) {
    if ((p_tcp->field_0x1638 & 2) == 0) {
      poVar17 = (opj_t2_t *)&local_34;
      local_34 = (p_max_length + (int)p_src_data) - (int)poVar16;
      local_90 = &local_70;
    }
    else {
      local_90 = (opj_cp_t **)&p_tcp->ppt_data;
      poVar16 = (opj_cp_t *)p_tcp->ppt_data;
      poVar17 = (opj_t2_t *)&p_tcp->ppt_len;
    }
  }
  else {
    local_90 = &p_t2[3].cp;
    poVar16 = p_t2[3].cp;
    poVar17 = p_t2 + 4;
  }
  opj_bio_init_dec(bio,(OPJ_BYTE *)poVar16,*(OPJ_UINT32 *)&poVar17->image);
  OVar6 = opj_bio_read(bio,1);
  if (OVar6 == 0) {
    opj_bio_inalign(bio);
    pVar9 = opj_bio_numbytes(bio);
    pOVar20 = (OPJ_BYTE *)((long)&poVar16->rsiz + pVar9);
    opj_bio_destroy(bio);
    if ((p_tcp->csty & 4) != 0) {
      if ((*(int *)local_90 - (int)pOVar20) + *(OPJ_UINT32 *)&poVar17->image < 2) {
        pcVar12 = "Not enough space for expected EPH marker\n";
      }
      else {
        if ((*pOVar20 == 0xff) && (pOVar20[1] == 0x92)) {
          pOVar20 = pOVar20 + 2;
          goto LAB_00136296;
        }
        pcVar12 = "Expected EPH marker\n";
      }
      opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar12);
    }
LAB_00136296:
    poVar16 = *local_90;
    uVar15 = (int)pOVar20 - (int)poVar16;
    *(OPJ_UINT32 *)&poVar17->image = *(OPJ_UINT32 *)&poVar17->image - uVar15;
    *local_90 = (opj_cp_t *)((long)&poVar16->rsiz + (ulong)uVar15);
    *local_68 = 0;
    *p_data_read = (int)local_70 - (int)p_src_data;
    return 1;
  }
  pOVar18 = local_68;
  local_58 = poVar17;
  local_48 = poVar16;
  if (*(int *)(lVar11 + 0x18) != 0) {
    poVar14 = (opj_tcd_band_t *)(lVar11 + 0x20);
    uVar15 = 0;
    do {
      uVar1 = p_pi->precno;
      poVar2 = poVar14->precincts;
      local_5c = uVar15;
      OVar4 = opj_tcd_is_band_empty(poVar14);
      if ((OVar4 == 0) && (local_60 = poVar2[uVar1].ch * poVar2[uVar1].cw, local_60 != 0)) {
        cblk = poVar2[uVar1].cblks.dec;
        local_94 = 0;
        local_50 = poVar14;
        local_40 = p_src_data;
        do {
          if (cblk->numsegs == 0) {
            OVar6 = opj_tgt_decode(bio,poVar2[uVar1].incltree,local_94,p_pi->layno + 1);
          }
          else {
            OVar6 = opj_bio_read(bio,1);
          }
          if (OVar6 == 0) {
            cblk->numnewpasses = 0;
          }
          else {
            if (cblk->numsegs == 0) {
              iVar5 = 0;
              do {
                OVar6 = opj_tgt_decode(bio,poVar2[uVar1].imsbtree,local_94,iVar5);
                iVar5 = iVar5 + 1;
              } while (OVar6 == 0);
              cblk->numbps = (local_50->numbps - iVar5) + 2;
              cblk->numlenbits = 3;
            }
            OVar7 = 1;
            OVar6 = opj_bio_read(bio,1);
            if (OVar6 != 0) {
              OVar6 = opj_bio_read(bio,1);
              if (OVar6 == 0) {
                OVar7 = 2;
              }
              else {
                OVar7 = opj_bio_read(bio,2);
                if (OVar7 == 3) {
                  OVar7 = opj_bio_read(bio,5);
                  if (OVar7 == 0x1f) {
                    OVar7 = opj_bio_read(bio,7);
                    OVar7 = OVar7 + 0x25;
                  }
                  else {
                    OVar7 = OVar7 + 6;
                  }
                }
                else {
                  OVar7 = OVar7 + 3;
                }
              }
            }
            cblk->numnewpasses = OVar7;
            iVar5 = -1;
            do {
              OVar6 = opj_bio_read(bio,1);
              iVar5 = iVar5 + 1;
            } while (OVar6 != 0);
            cblk->numlenbits = cblk->numlenbits + iVar5;
            uVar15 = cblk->numsegs;
            if (uVar15 == 0) {
              uVar19 = 0;
              iVar5 = opj_t2_init_seg(cblk,0,p_tcp->tccps[p_pi->compno].cblksty,1);
LAB_001360bb:
              if (iVar5 == 0) goto LAB_0013621d;
            }
            else {
              uVar19 = (ulong)(uVar15 - 1);
              if (cblk->segs[uVar19].numpasses == cblk->segs[uVar19].maxpasses) {
                iVar5 = opj_t2_init_seg(cblk,uVar15,p_tcp->tccps[p_pi->compno].cblksty,0);
                uVar19 = (ulong)uVar15;
                goto LAB_001360bb;
              }
            }
            uVar15 = cblk->numnewpasses;
            while( true ) {
              poVar3 = cblk->segs;
              uVar8 = poVar3[uVar19].maxpasses - poVar3[uVar19].numpasses;
              if ((int)uVar15 <= (int)uVar8) {
                uVar8 = uVar15;
              }
              poVar3[uVar19].numnewpasses = uVar8;
              iVar5 = 0;
              if (1 < uVar8) {
                iVar5 = 0;
                uVar13 = (ulong)uVar8;
                do {
                  iVar5 = iVar5 + 1;
                  uVar8 = (uint)uVar13;
                  uVar13 = uVar13 >> 1;
                } while (3 < uVar8);
              }
              uVar8 = iVar5 + cblk->numlenbits;
              if (0x20 < uVar8) {
                opj_event_msg((opj_event_mgr_t *)p_pack_info,1,
                              "Invalid bit number %d in opj_t2_read_packet_header()\n");
                goto LAB_0013621d;
              }
              OVar6 = opj_bio_read(bio,uVar8);
              poVar3 = cblk->segs;
              poVar3[uVar19].newlen = OVar6;
              OVar6 = poVar3[uVar19].numnewpasses;
              uVar8 = uVar15 - OVar6;
              if (uVar8 == 0 || (int)uVar15 < (int)OVar6) break;
              uVar15 = (int)uVar19 + 1;
              uVar19 = (ulong)uVar15;
              OVar4 = opj_t2_init_seg(cblk,uVar15,p_tcp->tccps[p_pi->compno].cblksty,0);
              uVar15 = uVar8;
              if (OVar4 == 0) goto LAB_0013621d;
            }
          }
          cblk = cblk + 1;
          local_94 = local_94 + 1;
          poVar14 = local_50;
          p_src_data = local_40;
          pOVar18 = local_68;
        } while (local_94 != local_60);
      }
      uVar15 = local_5c + 1;
      poVar14 = poVar14 + 1;
    } while (uVar15 < *(uint *)(lVar11 + 0x18));
  }
  OVar4 = opj_bio_inalign(bio);
  if (OVar4 == 0) {
LAB_0013621d:
    opj_bio_destroy(bio);
    return 0;
  }
  pVar9 = opj_bio_numbytes(bio);
  pOVar20 = (OPJ_BYTE *)((long)&local_48->rsiz + pVar9);
  opj_bio_destroy(bio);
  poVar17 = local_58;
  if ((p_tcp->csty & 4) != 0) {
    if ((*(int *)local_90 - (int)pOVar20) + *(OPJ_UINT32 *)&local_58->image < 2) {
      pcVar12 = "Not enough space for expected EPH marker\n";
    }
    else {
      if ((*pOVar20 == 0xff) && (pOVar20[1] == 0x92)) {
        pOVar20 = pOVar20 + 2;
        goto LAB_001362ed;
      }
      pcVar12 = "Expected EPH marker\n";
    }
    opj_event_msg((opj_event_mgr_t *)p_pack_info,2,pcVar12);
  }
LAB_001362ed:
  poVar16 = *local_90;
  uVar15 = (int)pOVar20 - (int)poVar16;
  *(OPJ_UINT32 *)&poVar17->image = *(OPJ_UINT32 *)&poVar17->image - uVar15;
  *local_90 = (opj_cp_t *)((long)&poVar16->rsiz + (ulong)uVar15);
  *pOVar18 = 1;
  *p_data_read = (int)local_70 - (int)p_src_data;
  return 1;
}

Assistant:

static OPJ_BOOL opj_t2_read_packet_header(opj_t2_t* p_t2,
        opj_tcd_tile_t *p_tile,
        opj_tcp_t *p_tcp,
        opj_pi_iterator_t *p_pi,
        OPJ_BOOL * p_is_data_present,
        OPJ_BYTE *p_src_data,
        OPJ_UINT32 * p_data_read,
        OPJ_UINT32 p_max_length,
        opj_packet_info_t *p_pack_info,
        opj_event_mgr_t *p_manager)

{
    /* loop */
    OPJ_UINT32 bandno, cblkno;
    OPJ_UINT32 l_nb_code_blocks;
    OPJ_UINT32 l_remaining_length;
    OPJ_UINT32 l_header_length;
    OPJ_UINT32 * l_modified_length_ptr = 00;
    OPJ_BYTE *l_current_data = p_src_data;
    opj_cp_t *l_cp = p_t2->cp;
    opj_bio_t *l_bio = 00;  /* BIO component */
    opj_tcd_band_t *l_band = 00;
    opj_tcd_cblk_dec_t* l_cblk = 00;
    opj_tcd_resolution_t* l_res =
        &p_tile->comps[p_pi->compno].resolutions[p_pi->resno];

    OPJ_BYTE *l_header_data = 00;
    OPJ_BYTE **l_header_data_start = 00;

    OPJ_UINT32 l_present;

    if (p_pi->layno == 0) {
        l_band = l_res->bands;

        /* reset tagtrees */
        for (bandno = 0; bandno < l_res->numbands; ++bandno) {
            if (!opj_tcd_is_band_empty(l_band)) {
                opj_tcd_precinct_t *l_prc = &l_band->precincts[p_pi->precno];
                if (!(p_pi->precno < (l_band->precincts_data_size / sizeof(
                                          opj_tcd_precinct_t)))) {
                    opj_event_msg(p_manager, EVT_ERROR, "Invalid precinct\n");
                    return OPJ_FALSE;
                }


                opj_tgt_reset(l_prc->incltree);
                opj_tgt_reset(l_prc->imsbtree);
                l_cblk = l_prc->cblks.dec;

                l_nb_code_blocks = l_prc->cw * l_prc->ch;
                for (cblkno = 0; cblkno < l_nb_code_blocks; ++cblkno) {
                    l_cblk->numsegs = 0;
                    l_cblk->real_num_segs = 0;
                    ++l_cblk;
                }
            }

            ++l_band;
        }
    }

    /* SOP markers */

    if (p_tcp->csty & J2K_CP_CSTY_SOP) {
        if (p_max_length < 6) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected SOP marker\n");
        } else if ((*l_current_data) != 0xff || (*(l_current_data + 1) != 0x91)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected SOP marker\n");
        } else {
            l_current_data += 6;
        }

        /** TODO : check the Nsop value */
    }

    /*
    When the marker PPT/PPM is used the packet header are store in PPT/PPM marker
    This part deal with this caracteristic
    step 1: Read packet header in the saved structure
    step 2: Return to codestream for decoding
    */

    l_bio = opj_bio_create();
    if (! l_bio) {
        return OPJ_FALSE;
    }

    if (l_cp->ppm == 1) { /* PPM */
        l_header_data_start = &l_cp->ppm_data;
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(l_cp->ppm_len);

    } else if (p_tcp->ppt == 1) { /* PPT */
        l_header_data_start = &(p_tcp->ppt_data);
        l_header_data = *l_header_data_start;
        l_modified_length_ptr = &(p_tcp->ppt_len);
    } else { /* Normal Case */
        l_header_data_start = &(l_current_data);
        l_header_data = *l_header_data_start;
        l_remaining_length = (OPJ_UINT32)(p_src_data + p_max_length - l_header_data);
        l_modified_length_ptr = &(l_remaining_length);
    }

    opj_bio_init_dec(l_bio, l_header_data, *l_modified_length_ptr);

    l_present = opj_bio_read(l_bio, 1);
    JAS_FPRINTF(stderr, "present=%d \n", l_present);
    if (!l_present) {
        /* TODO MSD: no test to control the output of this function*/
        opj_bio_inalign(l_bio);
        l_header_data += opj_bio_numbytes(l_bio);
        opj_bio_destroy(l_bio);

        /* EPH markers */
        if (p_tcp->csty & J2K_CP_CSTY_EPH) {
            if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                    *l_header_data_start)) < 2U) {
                opj_event_msg(p_manager, EVT_WARNING,
                              "Not enough space for expected EPH marker\n");
            } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
                opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
            } else {
                l_header_data += 2;
            }
        }

        l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
        *l_modified_length_ptr -= l_header_length;
        *l_header_data_start += l_header_length;

        /* << INDEX */
        /* End of packet header position. Currently only represents the distance to start of packet
           Will be updated later by incrementing with packet start value */
        if (p_pack_info) {
            p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
        }
        /* INDEX >> */

        * p_is_data_present = OPJ_FALSE;
        *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);
        return OPJ_TRUE;
    }

    l_band = l_res->bands;
    for (bandno = 0; bandno < l_res->numbands; ++bandno, ++l_band) {
        opj_tcd_precinct_t *l_prc = &(l_band->precincts[p_pi->precno]);

        if (opj_tcd_is_band_empty(l_band)) {
            continue;
        }

        l_nb_code_blocks = l_prc->cw * l_prc->ch;
        l_cblk = l_prc->cblks.dec;
        for (cblkno = 0; cblkno < l_nb_code_blocks; cblkno++) {
            OPJ_UINT32 l_included, l_increment, l_segno;
            OPJ_INT32 n;

            /* if cblk not yet included before --> inclusion tagtree */
            if (!l_cblk->numsegs) {
                l_included = opj_tgt_decode(l_bio, l_prc->incltree, cblkno,
                                            (OPJ_INT32)(p_pi->layno + 1));
                /* else one bit */
            } else {
                l_included = opj_bio_read(l_bio, 1);
            }

            /* if cblk not included */
            if (!l_included) {
                l_cblk->numnewpasses = 0;
                ++l_cblk;
                JAS_FPRINTF(stderr, "included=%d \n", l_included);
                continue;
            }

            /* if cblk not yet included --> zero-bitplane tagtree */
            if (!l_cblk->numsegs) {
                OPJ_UINT32 i = 0;

                while (!opj_tgt_decode(l_bio, l_prc->imsbtree, cblkno, (OPJ_INT32)i)) {
                    ++i;
                }

                l_cblk->numbps = (OPJ_UINT32)l_band->numbps + 1 - i;
                l_cblk->numlenbits = 3;
            }

            /* number of coding passes */
            l_cblk->numnewpasses = opj_t2_getnumpasses(l_bio);
            l_increment = opj_t2_getcommacode(l_bio);

            /* length indicator increment */
            l_cblk->numlenbits += l_increment;
            l_segno = 0;

            if (!l_cblk->numsegs) {
                if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 1)) {
                    opj_bio_destroy(l_bio);
                    return OPJ_FALSE;
                }
            } else {
                l_segno = l_cblk->numsegs - 1;
                if (l_cblk->segs[l_segno].numpasses == l_cblk->segs[l_segno].maxpasses) {
                    ++l_segno;
                    if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                }
            }
            n = (OPJ_INT32)l_cblk->numnewpasses;

            do {
                OPJ_UINT32 bit_number;
                l_cblk->segs[l_segno].numnewpasses = (OPJ_UINT32)opj_int_min((OPJ_INT32)(
                        l_cblk->segs[l_segno].maxpasses - l_cblk->segs[l_segno].numpasses), n);
                bit_number = l_cblk->numlenbits + opj_uint_floorlog2(
                                 l_cblk->segs[l_segno].numnewpasses);
                if (bit_number > 32) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Invalid bit number %d in opj_t2_read_packet_header()\n",
                                  bit_number);
                    opj_bio_destroy(l_bio);
                    return OPJ_FALSE;
                }
                l_cblk->segs[l_segno].newlen = opj_bio_read(l_bio, bit_number);
                JAS_FPRINTF(stderr, "included=%d numnewpasses=%d increment=%d len=%d \n",
                            l_included, l_cblk->segs[l_segno].numnewpasses, l_increment,
                            l_cblk->segs[l_segno].newlen);

                n -= (OPJ_INT32)l_cblk->segs[l_segno].numnewpasses;
                if (n > 0) {
                    ++l_segno;

                    if (! opj_t2_init_seg(l_cblk, l_segno, p_tcp->tccps[p_pi->compno].cblksty, 0)) {
                        opj_bio_destroy(l_bio);
                        return OPJ_FALSE;
                    }
                }
            } while (n > 0);

            ++l_cblk;
        }
    }

    if (!opj_bio_inalign(l_bio)) {
        opj_bio_destroy(l_bio);
        return OPJ_FALSE;
    }

    l_header_data += opj_bio_numbytes(l_bio);
    opj_bio_destroy(l_bio);

    /* EPH markers */
    if (p_tcp->csty & J2K_CP_CSTY_EPH) {
        if ((*l_modified_length_ptr - (OPJ_UINT32)(l_header_data -
                *l_header_data_start)) < 2U) {
            opj_event_msg(p_manager, EVT_WARNING,
                          "Not enough space for expected EPH marker\n");
        } else if ((*l_header_data) != 0xff || (*(l_header_data + 1) != 0x92)) {
            opj_event_msg(p_manager, EVT_WARNING, "Expected EPH marker\n");
        } else {
            l_header_data += 2;
        }
    }

    l_header_length = (OPJ_UINT32)(l_header_data - *l_header_data_start);
    JAS_FPRINTF(stderr, "hdrlen=%d \n", l_header_length);
    JAS_FPRINTF(stderr, "packet body\n");
    *l_modified_length_ptr -= l_header_length;
    *l_header_data_start += l_header_length;

    /* << INDEX */
    /* End of packet header position. Currently only represents the distance to start of packet
     Will be updated later by incrementing with packet start value */
    if (p_pack_info) {
        p_pack_info->end_ph_pos = (OPJ_INT32)(l_current_data - p_src_data);
    }
    /* INDEX >> */

    *p_is_data_present = OPJ_TRUE;
    *p_data_read = (OPJ_UINT32)(l_current_data - p_src_data);

    return OPJ_TRUE;
}